

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O3

Vec_Int_t * Gia_ManLutCollect(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  ulong uVar5;
  int *piVar6;
  Vec_Int_t *p_01;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  
  uVar13 = p->nObjs;
  uVar10 = ~(p->vCos->nSize + p->vCis->nSize);
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < (uVar13 + uVar10) - 1) {
    iVar8 = uVar13 + uVar10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar8 << 2);
  }
  p_00->pArray = piVar4;
  if (1 < (int)uVar13) {
    lVar14 = 1;
    do {
      if (p->vMapping->nSize <= lVar14) goto LAB_00707120;
      if (p->vMapping->pArray[lVar14] != 0) {
        Vec_IntPush(p_00,(int)lVar14);
        uVar13 = p->nObjs;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (int)uVar13);
  }
  uVar10 = 0x10;
  if (0xe < uVar13 - 1) {
    uVar10 = uVar13;
  }
  if (uVar10 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar10 << 2);
  }
  memset(piVar4,0,(long)(int)uVar13 << 2);
  uVar5 = (ulong)p->vCos->nSize;
  if (0 < (long)uVar5) {
    piVar6 = p->vCos->pArray;
    uVar9 = 0;
    do {
      iVar8 = piVar6[uVar9];
      if (((long)iVar8 < 0) || ((int)uVar13 <= iVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar10 = iVar8 - (*(uint *)(p->pObjs + iVar8) & 0x1fffffff);
      if (((int)uVar10 < 0) || ((int)uVar13 <= (int)uVar10)) goto LAB_0070713f;
      piVar4[uVar10] = 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar5);
  }
  uVar10 = p_00->nSize;
  uVar5 = (ulong)(int)uVar10;
  uVar11 = 0;
  if (0 < (long)uVar5) {
    piVar6 = p_00->pArray;
    uVar9 = uVar5;
    do {
      iVar8 = piVar6[uVar9 - 1];
      lVar14 = (long)iVar8;
      if ((lVar14 < 0) || ((int)uVar13 <= iVar8)) goto LAB_00707120;
      uVar11 = p->vMapping->nSize;
      if ((int)uVar11 <= iVar8) goto LAB_00707120;
      piVar7 = p->vMapping->pArray;
      uVar1 = piVar7[lVar14];
      if (uVar11 <= uVar1 || (int)uVar1 < 0) goto LAB_00707120;
      iVar8 = piVar4[lVar14];
      piVar7 = piVar7 + uVar1;
      lVar14 = 0;
      while (lVar14 < *piVar7) {
        iVar2 = piVar7[lVar14 + 1];
        lVar12 = (long)iVar2;
        if ((lVar12 < 0) || ((int)uVar13 <= iVar2)) goto LAB_00707120;
        if (piVar4[lVar12] <= iVar8) {
          piVar4[lVar12] = iVar8 + 1;
        }
        lVar14 = lVar14 + 1;
        if (uVar11 <= uVar1 || (int)uVar1 < 0) goto LAB_00707120;
      }
      bVar3 = 1 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar3);
    if ((int)uVar10 < 1) {
      uVar11 = 0;
    }
    else {
      piVar6 = p_00->pArray;
      uVar9 = 0;
      do {
        iVar8 = piVar6[uVar9];
        if (((long)iVar8 < 0) || ((int)uVar13 <= iVar8)) goto LAB_00707120;
        if (uVar13 == uVar9) {
LAB_0070713f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar4[uVar9] = -piVar4[iVar8];
        uVar9 = uVar9 + 1;
        uVar11 = uVar10;
      } while (uVar5 != uVar9);
    }
  }
  if ((int)uVar13 < (int)uVar11) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  piVar6 = Abc_MergeSortCost(piVar4,uVar11);
  p_01 = (Vec_Int_t *)malloc(0x10);
  uVar13 = 0x10;
  if (0xe < uVar10 - 1) {
    uVar13 = uVar10;
  }
  p_01->nSize = 0;
  p_01->nCap = uVar13;
  if (uVar13 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)(int)uVar13 << 2);
  }
  p_01->pArray = piVar7;
  if (0 < (int)uVar10) {
    uVar9 = 0;
    do {
      if (uVar10 <= (uint)piVar6[uVar9]) {
LAB_00707120:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_01,p_00->pArray[(uint)piVar6[uVar9]]);
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
  }
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (piVar6 != (int *)0x0) {
    free(piVar6);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Gia_ManLutCollect( Gia_Man_t * p )
{
    Vec_Int_t * vLuts, * vDist, * vOrder;
    int i, k, Id, iFan, * pPerm;
    // collect LUTs
    vLuts = Vec_IntAlloc( Gia_ManAndNum(p) );
    Gia_ManForEachLut( p, Id )
        Vec_IntPush( vLuts, Id );
    // propagate distance
    vDist = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachCoDriverId( p, Id, i )
        Vec_IntWriteEntry( vDist, Id, 1 );
    Vec_IntForEachEntryReverse( vLuts, Id, i )
    {
        int Dist = 1 + Vec_IntEntry(vDist, Id);
        Gia_LutForEachFanin( p, Id, iFan, k )
            Vec_IntUpdateEntry( vDist, iFan, Dist );
    }
    // sort LUTs by distance
    k = 0;
    Vec_IntForEachEntry( vLuts, Id, i )
        Vec_IntWriteEntry( vDist, k++, -Vec_IntEntry(vDist, Id) );
    Vec_IntShrink( vDist, k );
    pPerm = Abc_MergeSortCost( Vec_IntArray(vDist), Vec_IntSize(vDist) );
    // collect
    vOrder = Vec_IntAlloc( Vec_IntSize(vLuts) );
    for ( i = 0; i < Vec_IntSize(vLuts); i++ )
        Vec_IntPush( vOrder, Vec_IntEntry(vLuts, pPerm[i]) );
    Vec_IntFree( vDist );
    Vec_IntFree( vLuts );
    ABC_FREE( pPerm );
    return vOrder;
}